

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O2

void Js::CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
               (JavascriptString *s,CharCount startIndex,CharCount appendCharLength,
               Builder<256U> *toString,bool appendChars)

{
  char16 c;
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  bool bVar3;
  charcount_t cVar4;
  undefined4 *puVar5;
  char16 *pcVar6;
  JavascriptString *s_00;
  char16_t *pcVar7;
  CharCount startIndex_00;
  char16_t *pcVar8;
  undefined7 in_register_00000081;
  ulong uVar9;
  char16_t *pcVar10;
  void *local_60;
  void *packedSubstringInfo;
  void *packedSubstringInfo2;
  undefined4 local_44;
  ulong local_40;
  CharCount local_34;
  
  uVar9 = (ulong)startIndex;
  local_34 = startIndex;
  if (s == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x429,"(s)","s");
    if (!bVar3) goto LAB_00be3e24;
    *puVar5 = 0;
    uVar9 = (ulong)local_34;
  }
  cVar4 = JavascriptString::GetLength(s);
  if (cVar4 < (uint)uVar9) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x42a,"(startIndex <= s->GetLength())",
                                "startIndex <= s->GetLength()");
    if (!bVar3) goto LAB_00be3e24;
    *puVar5 = 0;
    uVar9 = (ulong)local_34;
  }
  cVar4 = JavascriptString::GetLength(s);
  if (cVar4 - (int)uVar9 < appendCharLength) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x42b,"(appendCharLength <= s->GetLength() - startIndex)",
                                "appendCharLength <= s->GetLength() - startIndex");
    if (!bVar3) goto LAB_00be3e24;
    *puVar5 = 0;
    uVar9 = (ulong)local_34;
  }
  if (toString == (Builder<256U> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x42c,"(toString)","toString");
    if (!bVar3) goto LAB_00be3e24;
    *puVar5 = 0;
    uVar9 = (ulong)local_34;
  }
  if (toString->isFinalized == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x42d,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar3) goto LAB_00be3e24;
    *puVar5 = 0;
    uVar9 = (ulong)local_34;
  }
  if ((appendChars) && (toString->directCharLength != 0xffffffff)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x42f,"(!(appendChars && !toString->HasOnlyDirectChars()))",
                                "!(appendChars && !toString->HasOnlyDirectChars())");
    if (!bVar3) {
LAB_00be3e24:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    uVar9 = (ulong)local_34;
  }
  startIndex_00 = (CharCount)uVar9;
  if (appendCharLength == 0) {
    return;
  }
  bVar3 = Phases::IsEnabled((Phases *)&DAT_01453738,StringConcatPhase);
  local_40 = uVar9;
  if (bVar3) {
    local_44 = (undefined4)CONCAT71(in_register_00000081,appendChars);
    uVar9 = 8;
    if (appendCharLength < 8) {
      uVar9 = (ulong)appendCharLength;
    }
    packedSubstringInfo2 = toString;
    bVar3 = JavascriptString::IsFinalized(s);
    pcVar8 = L"";
    pcVar10 = L"";
    if (bVar3) {
      pcVar6 = JavascriptString::GetString(s);
      pcVar10 = pcVar6 + local_40;
    }
    bVar3 = JavascriptString::IsFinalized(s);
    startIndex_00 = local_34;
    if (!bVar3) {
      pcVar8 = L"...";
    }
    if (8 < appendCharLength) {
      pcVar8 = L"...";
    }
    pcVar7 = L"false";
    appendChars = SUB41(local_44,0);
    if (appendChars != false) {
      pcVar7 = L"true";
    }
    Output::Print(L"CompoundString::AppendGeneric(JavascriptString *s = \"%.*s%s\", startIndex = %u, appendCharLength = %u, appendChars = %s)\n"
                  ,uVar9,pcVar10,pcVar8,(ulong)local_34,(ulong)appendCharLength,pcVar7);
    Output::Flush();
    toString = (Builder<256U> *)packedSubstringInfo2;
  }
  if (appendChars == false) {
    if (toString->directCharLength == 0xffffffff) {
      if (appendCharLength == 1) goto LAB_00be3d54;
      bVar3 = Block::ShouldAppendChars(appendCharLength,8);
      if (bVar3) goto LAB_00be3cb4;
      Builder<256U>::SwitchToPointerMode(toString);
    }
    else if (appendCharLength == 1) {
      pJVar1 = (toString->scriptContext->super_ScriptContextBase).javascriptLibrary;
      pcVar6 = JavascriptString::GetString(s);
      s_00 = CharStringCache::GetStringForChar(&pJVar1->charStringCache,pcVar6[local_40]);
      bVar3 = TryAppendGeneric<Js::CompoundString::Builder<256u>>(s_00,1,toString);
      if (bVar3) {
        return;
      }
      Builder<256U>::AppendSlow(toString,s_00);
      return;
    }
    PackSubstringInfo(startIndex_00,appendCharLength,&local_60,&packedSubstringInfo);
    bVar3 = TryAppendGeneric<Js::CompoundString::Builder<256u>>
                      (s,local_60,packedSubstringInfo,appendCharLength,toString);
    if (!bVar3) {
      Builder<256U>::AppendSlow(toString,s,local_60,packedSubstringInfo,appendCharLength);
    }
  }
  else {
    if (appendCharLength != 1) {
LAB_00be3cb4:
      pcVar6 = JavascriptString::GetString(s);
      pcVar6 = pcVar6 + local_40;
      if (appendChars == false) {
        bVar3 = TryAppendFewCharsGeneric<Js::CompoundString::Builder<256u>>
                          (pcVar6,appendCharLength,toString);
      }
      else {
        bVar3 = TryAppendGeneric<Js::CompoundString::Builder<256u>>
                          (pcVar6,appendCharLength,toString);
      }
      if (bVar3 != false) {
        return;
      }
      Builder<256U>::AppendSlow(toString,pcVar6,appendCharLength);
      return;
    }
LAB_00be3d54:
    pcVar6 = JavascriptString::GetString(s);
    c = pcVar6[local_40];
    bVar3 = TryAppendGeneric<Js::CompoundString::Builder<256u>>(c,toString);
    if (!bVar3) {
      Builder<256U>::AppendSlow(toString,c);
      return;
    }
  }
  return;
}

Assistant:

inline void CompoundString::AppendGeneric(
        JavascriptString *const s,
        const CharCount startIndex,
        const CharCount appendCharLength,
        String *const toString,
        const bool appendChars)
    {
        Assert(s);
        Assert(startIndex <= s->GetLength());
        Assert(appendCharLength <= s->GetLength() - startIndex);
        Assert(toString);
        Assert(!toString->IsFinalized());
        Assert(toString->OwnsLastBlock());
        Assert(!(appendChars && !toString->HasOnlyDirectChars()));

        if(appendCharLength == 0)
            return;

        if(PHASE_TRACE_StringConcat)
        {
            Output::Print(
                _u("CompoundString::AppendGeneric(JavascriptString *s = \"%.*s%s\", startIndex = %u, appendCharLength = %u, appendChars = %s)\n"),
                min(static_cast<CharCount>(8), appendCharLength),
                s->IsFinalized() ? &s->GetString()[startIndex] : _u(""),
                !s->IsFinalized() || appendCharLength > 8 ? _u("...") : _u(""),
                startIndex,
                appendCharLength,
                appendChars ? _u("true") : _u("false"));
            Output::Flush();
        }

        if(appendChars || toString->HasOnlyDirectChars())
        {
            if(appendCharLength == 1)
            {
                const char16 c = toString->GetAppendStringBuffer(s)[startIndex];
                if(TryAppendGeneric(c, toString))
                    return;
                toString->AppendSlow(c);
                return;
            }

            if(appendChars || Block::ShouldAppendChars(appendCharLength, sizeof(void *)))
            {
                const char16 *const appendBuffer = &toString->GetAppendStringBuffer(s)[startIndex];
                if(appendChars
                        ? TryAppendGeneric(appendBuffer, appendCharLength, toString)
                        : TryAppendFewCharsGeneric(appendBuffer, appendCharLength, toString))
                {
                    return;
                }
                toString->AppendSlow(appendBuffer, appendCharLength);
                return;
            }

            toString->SwitchToPointerMode();
        }

        if(appendCharLength == 1)
        {
            JavascriptString *const js =
                toString->GetLibrary()->GetCharStringCache().GetStringForChar(toString->GetAppendStringBuffer(s)[startIndex]);
            if(TryAppendGeneric(js, 1, toString))
                return;
            toString->AppendSlow(js);
            return;
        }

        void *packedSubstringInfo, *packedSubstringInfo2;
        PackSubstringInfo(startIndex, appendCharLength, &packedSubstringInfo, &packedSubstringInfo2);
        if(TryAppendGeneric(s, packedSubstringInfo, packedSubstringInfo2, appendCharLength, toString))
            return;
        toString->AppendSlow(s, packedSubstringInfo, packedSubstringInfo2, appendCharLength);
    }